

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O0

void __thiscall
MeshDenoisingViaL0Minimization::solveVertices
          (MeshDenoisingViaL0Minimization *this,TriMesh *mesh,MatrixXd *initial_vertices_matrix,
          vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
          *edge_vertex_handle,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *coef,vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                *delta,double alpha,double beta)

{
  size_t *psVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  Index rows;
  Index cols;
  int iVar5;
  mapped_type *pmVar6;
  reference pEVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  double *pdVar13;
  pointer ppVar14;
  BaseHandle *pBVar15;
  Scalar *pSVar16;
  reference pvVar17;
  VertexIter VVar18;
  pair<std::_Rb_tree_const_iterator<OpenMesh::EdgeHandle>,_bool> pVar19;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
  GVar20;
  solve_retval<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  sVar21;
  VertexIter VVar22;
  undefined1 local_5a8 [8];
  Point pt;
  undefined1 auStack_588 [4];
  int index_1;
  value_handle local_580;
  uint uStack_57c;
  undefined1 local_578 [8];
  VertexIter v_it_1;
  undefined1 local_558 [8];
  MatrixXd vertices_term;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  local_358;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
  local_350;
  _Base_ptr local_340;
  int local_338;
  int local_334;
  Triplet<double,_int> local_330;
  _Self local_320;
  _Self local_318;
  iterator m_it;
  vector_type local_308;
  vector_type local_2f0;
  vector_type local_2d8;
  vector_type local_2c0;
  vector_type local_2a8;
  vector_type local_290;
  vector_type local_278;
  vector_type local_260;
  undefined1 auStack_248 [8];
  Point temp_delta;
  value_type local_228;
  double coe4;
  double coe3;
  double coe2;
  double coe1;
  VertexHandle v4;
  VertexHandle v3;
  VertexHandle v2;
  VertexHandle v1;
  int index;
  _Self local_1e8;
  iterator s_it;
  Point right;
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
  local_1b0;
  _Base_ptr local_198;
  undefined1 local_190;
  BaseHandle local_188;
  BaseHandle local_184;
  undefined1 local_180 [8];
  FaceEdgeIter fe_it;
  undefined1 local_160 [8];
  VertexFaceIter vf_it;
  undefined1 local_138 [8];
  VertexIter v_it;
  set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
  edge_handle;
  map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
  vertex_coef;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> triple;
  undefined1 local_a0 [8];
  SparseMatrix<double,_0,_int> coef_matrix;
  MatrixXd right_term;
  double beta_local;
  double alpha_local;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *delta_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *coef_local;
  vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
  *edge_vertex_handle_local;
  MatrixXd *initial_vertices_matrix_local;
  TriMesh *mesh_local;
  MeshDenoisingViaL0Minimization *this_local;
  
  right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (DenseIndex)beta;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)&coef_matrix.m_data.m_allocatedSize,
             initial_vertices_matrix);
  rows = (**(code **)(*(long *)&(mesh->super_Mesh).
                                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                .
                                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     + 0x10))();
  cols = (**(code **)(*(long *)&(mesh->super_Mesh).
                                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                .
                                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     + 0x10))();
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
            ((SparseMatrix<double,_0,_int> *)local_a0,rows,cols);
  psVar1 = &vertex_coef._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::vector
            ((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> *)
             psVar1);
  std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::clear
            ((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> *)
             psVar1);
  std::
  map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
  ::map((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
         *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
  ::set((set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
         *)&v_it.hnd_);
  VVar18 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)mesh);
  GVar20.hnd_.super_BaseHandle.idx_ = local_350.hnd_.super_BaseHandle.idx_;
  GVar20.skip_bits_ = local_350.skip_bits_;
  GVar20.mesh_ = local_350.mesh_;
  while( true ) {
    v_it.mesh_ = VVar18._8_8_;
    local_138 = (undefined1  [8])VVar18.mesh_;
    local_350 = GVar20;
    VVar18 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)mesh);
    vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ = VVar18.mesh_;
    bVar4 = OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                          *)local_138,
                         (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                          *)&vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.
                             lap_counter_);
    if (!bVar4) break;
    std::
    set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
    ::clear((set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
             *)&v_it.hnd_);
    std::
    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
    ::clear((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
             *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pvVar17 = OpenMesh::Iterators::
              GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
              ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                           *)local_138);
    pmVar6 = std::
             map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
             ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                           *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar17);
    *pmVar6 = 1.0;
    pvVar17 = OpenMesh::Iterators::
              GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
              ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                           *)local_138);
    fe_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ =
         (pvVar17->super_BaseHandle).idx_;
    OpenMesh::PolyConnectivity::vf_iter
              ((VertexFaceIter *)local_160,(PolyConnectivity *)mesh,
               (VertexHandle)fe_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_);
    while( true ) {
      bVar4 = OpenMesh::Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
              ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                          *)local_160);
      if (!bVar4) break;
      local_184.idx_ =
           (int)OpenMesh::Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                             *)local_160);
      OpenMesh::PolyConnectivity::fe_iter
                ((FaceEdgeIter *)local_180,(PolyConnectivity *)mesh,(FaceHandle)local_184.idx_);
      while( true ) {
        bVar4 = OpenMesh::Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                            *)local_180);
        if (!bVar4) break;
        local_188.idx_ =
             (int)OpenMesh::Iterators::
                  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                  ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                               *)local_180);
        pVar19 = std::
                 set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
                 ::insert((set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
                           *)&v_it.hnd_,(value_type *)&local_188);
        local_198 = (_Base_ptr)pVar19.first._M_node;
        local_190 = pVar19.second;
        OpenMesh::Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
        ::operator++(&local_1b0,
                     (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                      *)local_180,0);
      }
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                    *)(right.super_VectorDataT<double,_3>.values_ + 2),
                   (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                    *)local_160,0);
    }
    OpenMesh::VectorT<double,_3>::VectorT((VectorT<double,_3> *)&s_it,0.0,0.0,0.0);
    local_1e8._M_node =
         (_Base_ptr)
         std::
         set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
         ::begin((set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
                  *)&v_it.hnd_);
    while( true ) {
      _index = std::
               set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
               ::end((set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
                      *)&v_it.hnd_);
      bVar4 = std::operator!=(&local_1e8,(_Self *)&index);
      if (!bVar4) break;
      pEVar7 = std::_Rb_tree_const_iterator<OpenMesh::EdgeHandle>::operator*(&local_1e8);
      bVar4 = OpenMesh::PolyConnectivity::is_boundary
                        ((PolyConnectivity *)mesh,(EdgeHandle)(pEVar7->super_BaseHandle).idx_);
      if (!bVar4) {
        pBVar15 = &std::_Rb_tree_const_iterator<OpenMesh::EdgeHandle>::operator*(&local_1e8)->
                   super_BaseHandle;
        iVar5 = OpenMesh::BaseHandle::idx(pBVar15);
        pvVar8 = std::
                 vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                 ::operator[](edge_vertex_handle,(long)iVar5);
        pvVar9 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
                 operator[](pvVar8,0);
        v3.super_BaseHandle.idx_ = (BaseHandle)(pvVar9->super_BaseHandle).idx_;
        pvVar8 = std::
                 vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                 ::operator[](edge_vertex_handle,(long)iVar5);
        pvVar9 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
                 operator[](pvVar8,1);
        v4.super_BaseHandle.idx_ = (BaseHandle)(pvVar9->super_BaseHandle).idx_;
        pvVar8 = std::
                 vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                 ::operator[](edge_vertex_handle,(long)iVar5);
        pvVar9 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
                 operator[](pvVar8,2);
        coe1._4_4_ = (pvVar9->super_BaseHandle).idx_;
        pvVar8 = std::
                 vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                 ::operator[](edge_vertex_handle,(long)iVar5);
        pvVar9 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
                 operator[](pvVar8,3);
        coe1._0_4_ = (pvVar9->super_BaseHandle).idx_;
        pvVar10 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](coef,(long)iVar5);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,0);
        coe2 = *pvVar11;
        pvVar10 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](coef,(long)iVar5);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,1);
        coe3 = *pvVar11;
        pvVar10 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](coef,(long)iVar5);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,2);
        coe4 = *pvVar11;
        pvVar10 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](coef,(long)iVar5);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,3);
        local_228 = *pvVar11;
        pvVar12 = std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::operator[](delta,(long)iVar5);
        temp_delta.super_VectorDataT<double,_3>.values_[1] =
             (pvVar12->super_VectorDataT<double,_3>).values_[2];
        auStack_248 = (undefined1  [8])(pvVar12->super_VectorDataT<double,_3>).values_[0];
        temp_delta.super_VectorDataT<double,_3>.values_[0] =
             (pvVar12->super_VectorDataT<double,_3>).values_[1];
        pBVar15 = &OpenMesh::Iterators::
                   GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                   ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                *)local_138)->super_BaseHandle;
        bVar4 = OpenMesh::BaseHandle::operator==(&v3.super_BaseHandle,pBVar15);
        if (bVar4) {
          pmVar6 = std::
                   map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                   ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                 *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,&v3
                               );
          dVar2 = *pmVar6;
          dVar3 = (double)right_term.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_cols * coe2 * coe2;
          pmVar6 = std::
                   map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                   ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                 *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,&v3
                               );
          *pmVar6 = dVar3 + dVar2 + alpha;
          pmVar6 = std::
                   map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                   ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                 *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,&v4
                               );
          dVar2 = *pmVar6;
          dVar3 = (double)right_term.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_cols * coe2 * coe3;
          pmVar6 = std::
                   map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                   ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                 *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,&v4
                               );
          *pmVar6 = dVar3 + (dVar2 - alpha);
          pmVar6 = std::
                   map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                   ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                 *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (key_type *)((long)&coe1 + 4));
          dVar2 = *pmVar6;
          dVar3 = (double)right_term.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_cols * coe2 * coe4;
          pmVar6 = std::
                   map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                   ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                 *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (key_type *)((long)&coe1 + 4));
          *pmVar6 = dVar3 + dVar2 + alpha;
          pmVar6 = std::
                   map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                   ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                 *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (key_type *)&coe1);
          dVar2 = *pmVar6;
          dVar3 = (double)right_term.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_cols * coe2 * local_228;
          pmVar6 = std::
                   map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                   ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                 *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (key_type *)&coe1);
          *pmVar6 = dVar3 + (dVar2 - alpha);
          OpenMesh::VectorT<double,_3>::operator*
                    (&local_278,(VectorT<double,_3> *)auStack_248,
                     (double *)
                     &right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols);
          OpenMesh::VectorT<double,_3>::operator*(&local_260,&local_278,&coe2);
          OpenMesh::VectorT<double,_3>::operator+=((VectorT<double,_3> *)&s_it,&local_260);
        }
        else {
          pBVar15 = &OpenMesh::Iterators::
                     GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                     ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                  *)local_138)->super_BaseHandle;
          bVar4 = OpenMesh::BaseHandle::operator==(&v4.super_BaseHandle,pBVar15);
          if (bVar4) {
            pmVar6 = std::
                     map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                     ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                   *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  &v3);
            dVar2 = *pmVar6;
            dVar3 = (double)right_term.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols * coe3 * coe2;
            pmVar6 = std::
                     map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                     ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                   *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  &v3);
            *pmVar6 = dVar3 + (dVar2 - alpha);
            pmVar6 = std::
                     map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                     ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                   *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  &v4);
            dVar2 = *pmVar6;
            dVar3 = (double)right_term.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols * coe3 * coe3;
            pmVar6 = std::
                     map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                     ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                   *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  &v4);
            *pmVar6 = dVar3 + dVar2 + alpha;
            pmVar6 = std::
                     map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                     ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                   *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  (key_type *)((long)&coe1 + 4));
            dVar2 = *pmVar6;
            dVar3 = (double)right_term.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols * coe3 * coe4;
            pmVar6 = std::
                     map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                     ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                   *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  (key_type *)((long)&coe1 + 4));
            *pmVar6 = dVar3 + (dVar2 - alpha);
            pmVar6 = std::
                     map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                     ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                   *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  (key_type *)&coe1);
            dVar2 = *pmVar6;
            dVar3 = (double)right_term.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols * coe3 * local_228;
            pmVar6 = std::
                     map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                     ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                   *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  (key_type *)&coe1);
            *pmVar6 = dVar3 + dVar2 + alpha;
            OpenMesh::VectorT<double,_3>::operator*
                      (&local_2a8,(VectorT<double,_3> *)auStack_248,
                       (double *)
                       &right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols);
            OpenMesh::VectorT<double,_3>::operator*(&local_290,&local_2a8,&coe3);
            OpenMesh::VectorT<double,_3>::operator+=((VectorT<double,_3> *)&s_it,&local_290);
          }
          else {
            pBVar15 = &OpenMesh::Iterators::
                       GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                       ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                    *)local_138)->super_BaseHandle;
            bVar4 = OpenMesh::BaseHandle::operator==((BaseHandle *)((long)&coe1 + 4),pBVar15);
            if (bVar4) {
              pmVar6 = std::
                       map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                       ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                     *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count
                                    ,&v3);
              dVar2 = *pmVar6;
              dVar3 = (double)right_term.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols * coe4 * coe2;
              pmVar6 = std::
                       map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                       ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                     *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count
                                    ,&v3);
              *pmVar6 = dVar3 + dVar2 + alpha;
              pmVar6 = std::
                       map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                       ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                     *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count
                                    ,&v4);
              dVar2 = *pmVar6;
              dVar3 = (double)right_term.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols * coe4 * coe3;
              pmVar6 = std::
                       map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                       ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                     *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count
                                    ,&v4);
              *pmVar6 = dVar3 + (dVar2 - alpha);
              pmVar6 = std::
                       map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                       ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                     *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count
                                    ,(key_type *)((long)&coe1 + 4));
              dVar2 = *pmVar6;
              dVar3 = (double)right_term.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols * coe4 * coe4;
              pmVar6 = std::
                       map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                       ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                     *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count
                                    ,(key_type *)((long)&coe1 + 4));
              *pmVar6 = dVar3 + dVar2 + alpha;
              pmVar6 = std::
                       map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                       ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                     *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count
                                    ,(key_type *)&coe1);
              dVar2 = *pmVar6;
              dVar3 = (double)right_term.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols * coe4 * local_228;
              pmVar6 = std::
                       map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                       ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                     *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count
                                    ,(key_type *)&coe1);
              *pmVar6 = dVar3 + (dVar2 - alpha);
              OpenMesh::VectorT<double,_3>::operator*
                        (&local_2d8,(VectorT<double,_3> *)auStack_248,
                         (double *)
                         &right_term.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_cols);
              OpenMesh::VectorT<double,_3>::operator*(&local_2c0,&local_2d8,&coe4);
              OpenMesh::VectorT<double,_3>::operator+=((VectorT<double,_3> *)&s_it,&local_2c0);
            }
            else {
              pBVar15 = &OpenMesh::Iterators::
                         GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                         ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                      *)local_138)->super_BaseHandle;
              bVar4 = OpenMesh::BaseHandle::operator==((BaseHandle *)&coe1,pBVar15);
              if (bVar4) {
                pmVar6 = std::
                         map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                         ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                       *)&edge_handle._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,&v3);
                dVar2 = *pmVar6;
                dVar3 = (double)right_term.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols * local_228 * coe2;
                pmVar6 = std::
                         map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                         ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                       *)&edge_handle._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,&v3);
                *pmVar6 = dVar3 + (dVar2 - alpha);
                pmVar6 = std::
                         map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                         ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                       *)&edge_handle._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,&v4);
                dVar2 = *pmVar6;
                dVar3 = (double)right_term.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols * local_228 * coe3;
                pmVar6 = std::
                         map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                         ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                       *)&edge_handle._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,&v4);
                *pmVar6 = dVar3 + dVar2 + alpha;
                pmVar6 = std::
                         map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                         ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                       *)&edge_handle._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,(key_type *)((long)&coe1 + 4));
                dVar2 = *pmVar6;
                dVar3 = (double)right_term.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols * local_228 * coe4;
                pmVar6 = std::
                         map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                         ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                       *)&edge_handle._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,(key_type *)((long)&coe1 + 4));
                *pmVar6 = dVar3 + (dVar2 - alpha);
                pmVar6 = std::
                         map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                         ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                       *)&edge_handle._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,(key_type *)&coe1);
                dVar2 = *pmVar6;
                dVar3 = (double)right_term.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols * local_228 * local_228;
                pmVar6 = std::
                         map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                         ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                       *)&edge_handle._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,(key_type *)&coe1);
                *pmVar6 = dVar3 + dVar2 + alpha;
                OpenMesh::VectorT<double,_3>::operator*
                          (&local_308,(VectorT<double,_3> *)auStack_248,
                           (double *)
                           &right_term.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols);
                OpenMesh::VectorT<double,_3>::operator*(&local_2f0,&local_308,&local_228);
                OpenMesh::VectorT<double,_3>::operator+=((VectorT<double,_3> *)&s_it,&local_2f0);
              }
            }
          }
        }
      }
      m_it._M_node = (_Base_ptr)
                     std::_Rb_tree_const_iterator<OpenMesh::EdgeHandle>::operator++(&local_1e8,0);
    }
    pdVar13 = OpenMesh::VectorT<double,_3>::operator[]((VectorT<double,_3> *)&s_it,0);
    dVar2 = *pdVar13;
    pBVar15 = &OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
               ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                             *)local_138)->super_BaseHandle;
    iVar5 = OpenMesh::BaseHandle::idx(pBVar15);
    pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                         &coef_matrix.m_data.m_allocatedSize,(long)iVar5,0);
    *pSVar16 = *pSVar16 + dVar2;
    pdVar13 = OpenMesh::VectorT<double,_3>::operator[]((VectorT<double,_3> *)&s_it,1);
    dVar2 = *pdVar13;
    pBVar15 = &OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
               ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                             *)local_138)->super_BaseHandle;
    iVar5 = OpenMesh::BaseHandle::idx(pBVar15);
    pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                         &coef_matrix.m_data.m_allocatedSize,(long)iVar5,1);
    *pSVar16 = *pSVar16 + dVar2;
    pdVar13 = OpenMesh::VectorT<double,_3>::operator[]((VectorT<double,_3> *)&s_it,2);
    dVar2 = *pdVar13;
    pBVar15 = &OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
               ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                             *)local_138)->super_BaseHandle;
    iVar5 = OpenMesh::BaseHandle::idx(pBVar15);
    pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                         &coef_matrix.m_data.m_allocatedSize,(long)iVar5,2);
    *pSVar16 = dVar2 + *pSVar16;
    local_318._M_node =
         (_Base_ptr)
         std::
         map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
         ::begin((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                  *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count);
    while( true ) {
      local_320._M_node =
           (_Base_ptr)
           std::
           map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
           ::end((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                  *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar4 = std::operator!=(&local_318,&local_320);
      if (!bVar4) break;
      pBVar15 = &OpenMesh::Iterators::
                 GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                 ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                               *)local_138)->super_BaseHandle;
      local_334 = OpenMesh::BaseHandle::idx(pBVar15);
      ppVar14 = std::_Rb_tree_iterator<std::pair<const_OpenMesh::VertexHandle,_double>_>::operator->
                          (&local_318);
      local_338 = OpenMesh::BaseHandle::idx((BaseHandle *)ppVar14);
      ppVar14 = std::_Rb_tree_iterator<std::pair<const_OpenMesh::VertexHandle,_double>_>::operator->
                          (&local_318);
      Eigen::Triplet<double,_int>::Triplet(&local_330,&local_334,&local_338,&ppVar14->second);
      std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::
      push_back((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                 *)&vertex_coef._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_330);
      local_340 = (_Base_ptr)
                  std::_Rb_tree_iterator<std::pair<const_OpenMesh::VertexHandle,_double>_>::
                  operator++(&local_318,0);
    }
    GVar20 = OpenMesh::Iterators::
             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
             ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                           *)local_138,0);
    VVar18._8_8_ = v_it.mesh_;
    VVar18.mesh_ = (mesh_ptr)local_138;
  }
  psVar1 = &vertex_coef._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_358._M_current =
       (Triplet<double,_int> *)
       std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::
       begin((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> *)
             psVar1);
  solver._472_8_ =
       std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::end
                 ((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                   *)psVar1);
  Eigen::SparseMatrix<double,0,int>::
  setFromTriplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>>
            ((SparseMatrix<double,0,int> *)local_a0,&local_358,
             (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
              *)&solver.m_detPermR);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             &vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::analyzePattern
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             &vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols,(MatrixType *)local_a0);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             &vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols,(MatrixType *)local_a0);
  sVar21 = Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>::
           solve<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                     ((SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>> *)
                      &vertices_term.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                              &coef_matrix.m_data.m_allocatedSize);
  v_it_1._8_8_ = sVar21.
                 super_solve_retval_base<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 .m_dec;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::internal::solve_retval_base<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_558,
             (ReturnByValue<Eigen::internal::solve_retval_base<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&v_it_1.hnd_);
  VVar22 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)mesh);
  while( true ) {
    v_it_1.mesh_ = VVar22._8_8_;
    local_578 = (undefined1  [8])VVar22.mesh_;
    VVar18 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)mesh);
    _auStack_588 = VVar18;
    bVar4 = OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                          *)local_578,
                         (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                          *)auStack_588);
    if (!bVar4) break;
    pBVar15 = &OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
               ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                             *)local_578)->super_BaseHandle;
    pt.super_VectorDataT<double,_3>.values_[2]._4_4_ = OpenMesh::BaseHandle::idx(pBVar15);
    pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_558,
                         (long)pt.super_VectorDataT<double,_3>.values_[2]._4_4_,0);
    dVar2 = *pSVar16;
    pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_558,
                         (long)pt.super_VectorDataT<double,_3>.values_[2]._4_4_,1);
    dVar3 = *pSVar16;
    pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_558,
                         (long)pt.super_VectorDataT<double,_3>.values_[2]._4_4_,2);
    OpenMesh::VectorT<double,_3>::VectorT((VectorT<double,_3> *)local_5a8,dVar2,dVar3,*pSVar16);
    pvVar17 = OpenMesh::Iterators::
              GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
              ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                           *)local_578);
    OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
    set_point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *
              )mesh,(VertexHandle)(pvVar17->super_BaseHandle).idx_,(Point *)local_5a8);
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  *)local_578,0);
    VVar22._8_8_ = v_it_1.mesh_;
    VVar22.mesh_ = (mesh_ptr)local_578;
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_558);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             &vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols);
  std::
  set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
  ::~set((set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
          *)&v_it.hnd_);
  std::
  map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
  ::~map((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
          *)&edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::~vector
            ((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> *)
             &vertex_coef._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix((SparseMatrix<double,_0,_int> *)local_a0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)&coef_matrix.m_data.m_allocatedSize);
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::solveVertices(TriMesh &mesh, Eigen::MatrixXd &initial_vertices_matrix,
                                                   std::vector< std::vector<TriMesh::VertexHandle> > &edge_vertex_handle,
                                                   std::vector< std::vector<double> > &coef, std::vector<TriMesh::Point> &delta,
                                                   double alpha, double beta)
{
    Eigen::MatrixXd right_term = initial_vertices_matrix;
    Eigen::SparseMatrix<double> coef_matrix((int)mesh.n_vertices(), (int)mesh.n_vertices());

    std::vector< Eigen::Triplet<double> > triple; triple.clear();

    std::map<TriMesh::VertexHandle, double> vertex_coef;
    std::set<TriMesh::EdgeHandle> edge_handle;;
    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        edge_handle.clear();
        vertex_coef.clear();
        vertex_coef[*v_it] = 1.0;
        for(TriMesh::VertexFaceIter vf_it = mesh.vf_iter(*v_it); vf_it.is_valid(); vf_it++)
        {
            for(TriMesh::FaceEdgeIter fe_it = mesh.fe_iter(*vf_it); fe_it.is_valid(); fe_it++)
            {
                edge_handle.insert(*fe_it);
            }
        }

        TriMesh::Point right(0.0, 0.0, 0.0);
        for(std::set<TriMesh::EdgeHandle>::iterator s_it = edge_handle.begin(); s_it != edge_handle.end(); s_it++)
        {
            if(!mesh.is_boundary(*s_it))
            {
                int index = (*s_it).idx();
                TriMesh::VertexHandle v1 = edge_vertex_handle[index][0],
                        v2 = edge_vertex_handle[index][1],
                        v3 = edge_vertex_handle[index][2],
                        v4 = edge_vertex_handle[index][3];
                double coe1 = coef[index][0],
                        coe2 = coef[index][1],
                        coe3 = coef[index][2],
                        coe4 = coef[index][3];
                TriMesh::Point temp_delta = delta[index];
                if(v1 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] + alpha + beta * coe1 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] - alpha + beta * coe1 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] + alpha + beta * coe1 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] - alpha + beta * coe1 * coe4;
                    right += temp_delta * beta * coe1;
                }
                else if(v2 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] - alpha + beta * coe2 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] + alpha + beta * coe2 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] - alpha + beta * coe2 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] + alpha + beta * coe2 * coe4;
                    right += temp_delta * beta * coe2;
                }
                else if(v3 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] + alpha + beta * coe3 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] - alpha + beta * coe3 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] + alpha + beta * coe3 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] - alpha + beta * coe3 * coe4;
                    right += temp_delta * beta * coe3;
                }
                else if(v4 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] - alpha + beta * coe4 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] + alpha + beta * coe4 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] - alpha + beta * coe4 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] + alpha + beta * coe4 * coe4;
                    right += temp_delta * beta * coe4;
                }
            }
        }
        right_term(v_it->idx(), 0) += right[0];
        right_term(v_it->idx(), 1) += right[1];
        right_term(v_it->idx(), 2) += right[2];

        for(std::map<TriMesh::VertexHandle, double>::iterator m_it = vertex_coef.begin(); m_it != vertex_coef.end(); m_it++)
        {
            triple.push_back(Eigen::Triplet<double>(v_it->idx(), m_it->first.idx(), m_it->second));
        }
    }
    coef_matrix.setFromTriplets(triple.begin(), triple.end());

    Eigen::SparseLU<Eigen::SparseMatrix<double> > solver;
    solver.analyzePattern(coef_matrix);
    solver.factorize(coef_matrix);
    Eigen::MatrixXd vertices_term = solver.solve(right_term);

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        int index = v_it->idx();
        TriMesh::Point pt = TriMesh::Point(vertices_term(index,0), vertices_term(index,1), vertices_term(index,2));
        mesh.set_point(*v_it, pt);
    }
}